

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O0

int ur_kinematics::inverse(double *T,double *q_sols,double q6_des)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_22c;
  int k;
  double s23_1;
  double c23_1;
  double s23_0;
  double c23_0;
  double B_1;
  double A_1;
  double s3;
  double denom;
  double arccos_3;
  double c3;
  double p13y;
  double p13x;
  double x04y;
  double x04x;
  double s6;
  double c6;
  double q4 [2];
  double q3 [2];
  double q2 [2];
  double q6;
  double s5;
  double c5;
  double s1;
  double c1;
  int j;
  int i_1;
  double arccos_2;
  double div_2;
  double numer;
  int i;
  double q5 [2] [2];
  double local_100;
  double neg;
  double pos;
  double arctan;
  double arccos_1;
  double arccos;
  double div_1;
  double arcsin;
  double div;
  double R;
  double B;
  double A;
  double q1 [2];
  double T23;
  double T21;
  double T20;
  double T22;
  double T13;
  double T11;
  double T10;
  double T12;
  double T03;
  double T01;
  double T00;
  double T02;
  int num_sols;
  double q6_des_local;
  double *q_sols_local;
  double *T_local;
  
  T02._4_4_ = 0;
  dVar11 = -*T;
  dVar1 = T[1];
  dVar2 = T[2];
  dVar12 = -T[3];
  dVar13 = -T[4];
  dVar3 = T[5];
  dVar4 = T[6];
  dVar14 = -T[7];
  dVar5 = T[8];
  dVar6 = T[9];
  dVar7 = T[10];
  dVar8 = T[0xb];
  dVar15 = dVar13 * 0.0996 + -dVar14;
  dVar16 = dVar11 * 0.0996 + -dVar12;
  dVar17 = dVar15 * dVar15 + dVar16 * dVar16;
  if (1e-08 <= ABS(dVar15)) {
    if (1e-08 <= ABS(dVar16)) {
      if (dVar17 < 0.01776889) {
        return 0;
      }
      dVar17 = sqrt(dVar17);
      dVar17 = acos(0.1333 / dVar17);
      local_100 = atan2(-dVar16,dVar15);
      local_100 = -dVar17 + local_100;
      if (ABS(local_100) < 1e-08) {
        local_100 = 0.0;
      }
      if (local_100 < 0.0) {
        q1[0] = local_100 + 6.28318530717958;
      }
      else {
        q1[0] = local_100;
      }
    }
    else {
      if (1e-08 <= ABS(0.1333 - ABS(dVar15))) {
        arccos = 0.1333 / dVar15;
      }
      else {
        iVar9 = anon_unknown_0::SIGN(0.1333);
        iVar10 = anon_unknown_0::SIGN(dVar15);
        arccos = (double)(iVar9 * iVar10);
      }
      dVar15 = acos(arccos);
      q1[0] = 6.28318530717958 - dVar15;
    }
  }
  else {
    if (1e-08 <= ABS(0.1333 - ABS(dVar16))) {
      arcsin = -0.1333 / dVar16;
    }
    else {
      iVar9 = anon_unknown_0::SIGN(0.1333);
      iVar10 = anon_unknown_0::SIGN(dVar16);
      arcsin = (double)(-iVar9 * iVar10);
    }
    div_1 = asin(arcsin);
    if (ABS(div_1) < 1e-08) {
      div_1 = 0.0;
    }
    q1[0] = 3.14159265358979 - div_1;
  }
  for (numer._4_4_ = 0; numer._4_4_ < 2; numer._4_4_ = numer._4_4_ + 1) {
    dVar15 = sin(q1[(long)numer._4_4_ + -1]);
    dVar16 = cos(q1[(long)numer._4_4_ + -1]);
    dVar15 = (dVar12 * dVar15 + -(dVar14 * dVar16)) - 0.1333;
    if (1e-08 <= ABS(ABS(dVar15) - 0.0996)) {
      arccos_2 = dVar15 / 0.0996;
    }
    else {
      iVar9 = anon_unknown_0::SIGN(dVar15);
      iVar10 = anon_unknown_0::SIGN(0.0996);
      arccos_2 = (double)(iVar9 * iVar10);
    }
    dVar15 = acos(arccos_2);
    *(double *)(&stack0xfffffffffffffed8 + (long)numer._4_4_ * 0x10) = dVar15;
    q5[numer._4_4_][0] = 6.28318530717958 - dVar15;
  }
  c1._4_4_ = 0;
  do {
    if (1 < c1._4_4_) {
      return T02._4_4_;
    }
    for (c1._0_4_ = 0; c1._0_4_ < 2; c1._0_4_ = c1._0_4_ + 1) {
      dVar15 = cos(q1[(long)c1._4_4_ + -1]);
      dVar16 = sin(q1[(long)c1._4_4_ + -1]);
      dVar17 = cos(*(double *)
                    (&stack0xfffffffffffffed8 + (long)c1._0_4_ * 8 + (long)c1._4_4_ * 0x10));
      dVar18 = sin(*(double *)
                    (&stack0xfffffffffffffed8 + (long)c1._0_4_ * 8 + (long)c1._4_4_ * 0x10));
      q2[1] = q6_des;
      if (1e-08 <= ABS(dVar18)) {
        iVar9 = anon_unknown_0::SIGN(dVar18);
        iVar10 = anon_unknown_0::SIGN(dVar18);
        q2[1] = atan2((double)iVar9 * -(dVar2 * dVar16 + -(dVar4 * dVar15)),
                      (double)iVar10 * (dVar1 * dVar16 + -(dVar3 * dVar15)));
        if (ABS(q2[1]) < 1e-08) {
          q2[1] = 0.0;
        }
        if (q2[1] < 0.0) {
          q2[1] = q2[1] + 6.28318530717958;
        }
      }
      dVar19 = cos(q2[1]);
      dVar20 = sin(q2[1]);
      dVar21 = -dVar18 * (dVar11 * dVar15 + dVar13 * dVar16) +
               -(dVar17 * (dVar20 * (dVar2 * dVar15 + dVar4 * dVar16) +
                          -(dVar19 * (dVar1 * dVar15 + dVar3 * dVar16))));
      dVar17 = dVar17 * (-dVar6 * dVar19 + -(-dVar7 * dVar20)) + -(dVar5 * dVar18);
      dVar15 = dVar14 * dVar16 +
               dVar12 * dVar15 +
               (dVar20 * (dVar1 * dVar15 + dVar3 * dVar16) +
               dVar19 * (dVar2 * dVar15 + dVar4 * dVar16)) * 0.0997 +
               -((dVar11 * dVar15 + dVar13 * dVar16) * 0.0996);
      dVar16 = (-dVar7 * dVar19 + -dVar6 * dVar20) * 0.0997 + dVar5 * -0.0996 + (dVar8 - 0.1625);
      arccos_3 = (((dVar15 * dVar15 + dVar16 * dVar16) - 0.18062499999999998) - 0.15382084) /
                 0.33337;
      if (1e-08 <= ABS(ABS(arccos_3) - 1.0)) {
        if (ABS(arccos_3) <= 1.0) goto LAB_0014d6c1;
      }
      else {
        iVar9 = anon_unknown_0::SIGN(arccos_3);
        arccos_3 = (double)iVar9;
LAB_0014d6c1:
        q4[1] = acos(arccos_3);
        q3[0] = 6.28318530717958 - q4[1];
        dVar18 = arccos_3 * 0.33337 + 0.33444584;
        dVar20 = sin(q4[1]);
        dVar19 = arccos_3 * -0.3922 + -0.425;
        dVar20 = dVar20 * -0.3922;
        q3[1] = atan2((dVar19 * dVar16 + -(dVar20 * dVar15)) / dVar18,
                      (dVar19 * dVar15 + dVar20 * dVar16) / dVar18);
        dVar15 = atan2((dVar19 * dVar16 + dVar20 * dVar15) / dVar18,
                       (dVar19 * dVar15 + -(dVar20 * dVar16)) / dVar18);
        dVar16 = cos(q3[1] + q4[1]);
        dVar18 = sin(q3[1] + q4[1]);
        dVar19 = cos(dVar15 + q3[0]);
        dVar15 = sin(dVar15 + q3[0]);
        atan2(dVar16 * dVar17 + -(dVar18 * dVar21),dVar21 * dVar16 + dVar17 * dVar18);
        q4[0] = atan2(dVar19 * dVar17 + -(dVar15 * dVar21),dVar21 * dVar19 + dVar17 * dVar15);
        for (local_22c = 0; local_22c < 2; local_22c = local_22c + 1) {
          if (1e-08 <= ABS(q3[(long)local_22c + 1])) {
            if (q3[(long)local_22c + 1] <= 0.0 && q3[(long)local_22c + 1] != 0.0) {
              q3[(long)local_22c + 1] = q3[(long)local_22c + 1] + 6.28318530717958;
            }
          }
          else {
            q3[(long)local_22c + 1] = 0.0;
          }
          if (1e-08 <= ABS(q4[(long)local_22c + -1])) {
            if (q4[(long)local_22c + -1] <= 0.0 && q4[(long)local_22c + -1] != 0.0) {
              q4[(long)local_22c + -1] = q4[(long)local_22c + -1] + 6.28318530717958;
            }
          }
          else {
            q4[(long)local_22c + -1] = 0.0;
          }
          q_sols[T02._4_4_ * 6] = q1[(long)c1._4_4_ + -1];
          q_sols[T02._4_4_ * 6 + 1] = q3[(long)local_22c + 1];
          q_sols[T02._4_4_ * 6 + 2] = q4[(long)local_22c + 1];
          q_sols[T02._4_4_ * 6 + 3] = q4[(long)local_22c + -1];
          q_sols[T02._4_4_ * 6 + 4] =
               *(double *)(&stack0xfffffffffffffed8 + (long)c1._0_4_ * 8 + (long)c1._4_4_ * 0x10);
          q_sols[T02._4_4_ * 6 + 5] = q2[1];
          T02._4_4_ = T02._4_4_ + 1;
        }
      }
    }
    c1._4_4_ = c1._4_4_ + 1;
  } while( true );
}

Assistant:

int inverse(const double* T, double* q_sols, double q6_des) {
    int num_sols = 0;
    double T02 = -*T; T++; double T00 =  *T; T++; double T01 =  *T; T++; double T03 = -*T; T++;
    double T12 = -*T; T++; double T10 =  *T; T++; double T11 =  *T; T++; double T13 = -*T; T++;
    double T22 =  *T; T++; double T20 = -*T; T++; double T21 = -*T; T++; double T23 =  *T;

    ////////////////////////////// shoulder rotate joint (q1) //////////////////////////////
    double q1[2];
    {
      double A = d6*T12 - T13;
      double B = d6*T02 - T03;
      double R = A*A + B*B;
      if(fabs(A) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(B)) < ZERO_THRESH)
          div = -SIGN(d4)*SIGN(B);
        else
          div = -d4/B;
        double arcsin = asin(div);
        if(fabs(arcsin) < ZERO_THRESH)
          arcsin = 0.0;
        if(arcsin < 0.0)
          q1[0] = arcsin + 2.0*PI;
        else
          q1[0] = arcsin;
        q1[1] = PI - arcsin;
      }
      else if(fabs(B) < ZERO_THRESH) {
        double div;
        if(fabs(fabs(d4) - fabs(A)) < ZERO_THRESH)
          div = SIGN(d4)*SIGN(A);
        else
          div = d4/A;
        double arccos = acos(div);
        q1[0] = arccos;
        q1[1] = 2.0*PI - arccos;
      }
      else if(d4*d4 > R) {
        return num_sols;
      }
      else {
        double arccos = acos(d4 / sqrt(R)) ;
        double arctan = atan2(-B, A);
        double pos = arccos + arctan;
        double neg = -arccos + arctan;
        if(fabs(pos) < ZERO_THRESH)
          pos = 0.0;
        if(fabs(neg) < ZERO_THRESH)
          neg = 0.0;
        if(pos >= 0.0)
          q1[0] = pos;
        else
          q1[0] = 2.0*PI + pos;
        if(neg >= 0.0)
          q1[1] = neg;
        else
          q1[1] = 2.0*PI + neg;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    ////////////////////////////// wrist 2 joint (q5) //////////////////////////////
    double q5[2][2];
    {
      for(int i=0;i<2;i++) {
        double numer = (T03*sin(q1[i]) - T13*cos(q1[i])-d4);
        double div;
        if(fabs(fabs(numer) - fabs(d6)) < ZERO_THRESH)
          div = SIGN(numer) * SIGN(d6);
        else
          div = numer / d6;
        double arccos = acos(div);
        q5[i][0] = arccos;
        q5[i][1] = 2.0*PI - arccos;
      }
    }
    ////////////////////////////////////////////////////////////////////////////////

    {
      for(int i=0;i<2;i++) {
        for(int j=0;j<2;j++) {
          double c1 = cos(q1[i]), s1 = sin(q1[i]);
          double c5 = cos(q5[i][j]), s5 = sin(q5[i][j]);
          double q6;
          ////////////////////////////// wrist 3 joint (q6) //////////////////////////////
          if(fabs(s5) < ZERO_THRESH)
            q6 = q6_des;
          else {
            q6 = atan2(SIGN(s5)*-(T01*s1 - T11*c1),
                       SIGN(s5)*(T00*s1 - T10*c1));
            if(fabs(q6) < ZERO_THRESH)
              q6 = 0.0;
            if(q6 < 0.0)
              q6 += 2.0*PI;
          }
          ////////////////////////////////////////////////////////////////////////////////

          double q2[2], q3[2], q4[2];
          ///////////////////////////// RRR joints (q2,q3,q4) ////////////////////////////
          double c6 = cos(q6), s6 = sin(q6);
          double x04x = -s5*(T02*c1 + T12*s1) - c5*(s6*(T01*c1 + T11*s1) - c6*(T00*c1 + T10*s1));
          double x04y = c5*(T20*c6 - T21*s6) - T22*s5;
          double p13x = d5*(s6*(T00*c1 + T10*s1) + c6*(T01*c1 + T11*s1)) - d6*(T02*c1 + T12*s1) +
                        T03*c1 + T13*s1;
          double p13y = T23 - d1 - d6*T22 + d5*(T21*c6 + T20*s6);

          double c3 = (p13x*p13x + p13y*p13y - a2*a2 - a3*a3) / (2.0*a2*a3);
          if(fabs(fabs(c3) - 1.0) < ZERO_THRESH)
            c3 = SIGN(c3);
          else if(fabs(c3) > 1.0) {
            // TODO NO SOLUTION
            continue;
          }
          double arccos = acos(c3);
          q3[0] = arccos;
          q3[1] = 2.0*PI - arccos;
          double denom = a2*a2 + a3*a3 + 2*a2*a3*c3;
          double s3 = sin(arccos);
          double A = (a2 + a3*c3), B = a3*s3;
          q2[0] = atan2((A*p13y - B*p13x) / denom, (A*p13x + B*p13y) / denom);
          q2[1] = atan2((A*p13y + B*p13x) / denom, (A*p13x - B*p13y) / denom);
          double c23_0 = cos(q2[0]+q3[0]);
          double s23_0 = sin(q2[0]+q3[0]);
          double c23_1 = cos(q2[1]+q3[1]);
          double s23_1 = sin(q2[1]+q3[1]);
          q4[0] = atan2(c23_0*x04y - s23_0*x04x, x04x*c23_0 + x04y*s23_0);
          q4[1] = atan2(c23_1*x04y - s23_1*x04x, x04x*c23_1 + x04y*s23_1);
          ////////////////////////////////////////////////////////////////////////////////
          for(int k=0;k<2;k++) {
            if(fabs(q2[k]) < ZERO_THRESH)
              q2[k] = 0.0;
            else if(q2[k] < 0.0) q2[k] += 2.0*PI;
            if(fabs(q4[k]) < ZERO_THRESH)
              q4[k] = 0.0;
            else if(q4[k] < 0.0) q4[k] += 2.0*PI;
            q_sols[num_sols*6+0] = q1[i];    q_sols[num_sols*6+1] = q2[k];
            q_sols[num_sols*6+2] = q3[k];    q_sols[num_sols*6+3] = q4[k];
            q_sols[num_sols*6+4] = q5[i][j]; q_sols[num_sols*6+5] = q6;
            num_sols++;
          }

        }
      }
    }
    return num_sols;
  }